

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
* __thiscall
Board::get_endangered_pieces
          (map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
           *__return_storage_ptr__,Board *this,play *single_play)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  short sVar3;
  pointer ppVar4;
  element_type *peVar5;
  pointer ppVar6;
  long lVar7;
  _Rb_tree_impl<std::less<Point>,_true> *p_Var8;
  mapped_type *pmVar9;
  pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_> *move;
  pointer ppVar10;
  _Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar10 = (single_play->
            super__Vector_base<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (single_play->
           super__Vector_base<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppVar10 != ppVar4) {
    do {
      peVar5 = (ppVar10->second).super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar5 != (element_type *)0x0) {
        ppVar6 = (peVar5->m_positions).
                 super__Vector_base<std::pair<unsigned_int,_Point>,_std::allocator<std::pair<unsigned_int,_Point>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        sVar3 = ppVar6[-1].second.m_y;
        lVar7 = *(long *)&(this->m_board).m_data.
                          super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[ppVar6[-1].second.m_x].
                          super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
        ;
        pmVar9 = std::
                 map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                 ::operator[]((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                               *)&local_60,&ppVar6[-1].second);
        puVar2 = (undefined8 *)(lVar7 + (long)sVar3 * 0x10);
        (pmVar9->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)*puVar2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar9->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 1));
      }
      ppVar6 = *(pointer *)
                ((long)&(((ppVar10->first).super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_positions).
                        super__Vector_base<std::pair<unsigned_int,_Point>,_std::allocator<std::pair<unsigned_int,_Point>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      sVar3 = ppVar6[-1].second.m_y;
      lVar7 = *(long *)&(this->m_board).m_data.
                        super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[ppVar6[-1].second.m_x].
                        super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
      ;
      pmVar9 = std::
               map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
               ::operator[]((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                             *)&local_60,&ppVar6[-1].second);
      puVar2 = (undefined8 *)(lVar7 + (long)sVar3 * 0x10);
      (pmVar9->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)*puVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar9->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 1));
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != ppVar4);
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    p_Var8 = &(__return_storage_ptr__->_M_t)._M_impl;
  }
  else {
    p_Var8 = &local_60._M_impl;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
         local_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
         local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  (p_Var8->super__Rb_tree_header)._M_node_count = 0;
  std::
  _Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

map<Point, shared_ptr<Piece>> Board::get_endangered_pieces(const play &single_play) const {
    map<Point, shared_ptr<Piece>> endangered_pieces;
    for (const auto &move : single_play) {
        if (move.second != nullptr) {
            endangered_pieces[move.second->get_position()] = m_board[move.second->get_position()];
        }
        endangered_pieces[move.first->get_position()] = m_board[move.first->get_position()];
    }
    return move(endangered_pieces);
}